

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int check_OPP_for_Boolean_matching(saucy *s,coloring *c)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 local_38;
  
  if (&s->left != c) {
    for (iVar6 = 0; iVar6 < s->n; iVar6 = iVar6 + iVar1 + 1) {
      local_38 = 0;
      iVar5 = 0;
      iVar4 = 0;
      lVar3 = (long)iVar6;
      while( true ) {
        iVar1 = (s->right).clen[iVar6];
        if (iVar1 + iVar6 < lVar3) break;
        pcVar2 = getVertexName(s->pNtk,(s->left).lab[lVar3]);
        if ((*pcVar2 != 'N') || (pcVar2[2] != ':')) {
          __assert_fail("name[0] == \'N\' && name[2] == \':\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                        ,0x613,
                        "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
        }
        if (pcVar2[1] == '2') {
          local_38 = CONCAT44(local_38._4_4_,(int)local_38 + 1);
        }
        else {
          if (pcVar2[1] != '1') {
            __assert_fail("name[1] == \'2\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                          ,0x617,
                          "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
          }
          local_38 = CONCAT44(local_38._4_4_ + 1,(int)local_38);
        }
        pcVar2 = getVertexName(s->pNtk,(s->right).lab[lVar3]);
        if ((*pcVar2 != 'N') || (pcVar2[2] != ':')) {
          __assert_fail("name[0] == \'N\' && name[2] == \':\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                        ,0x61c,
                        "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
        }
        if (pcVar2[1] == '2') {
          iVar4 = iVar4 + 1;
        }
        else {
          if (pcVar2[1] != '1') {
            __assert_fail("name[1] == \'2\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSaucy.c"
                          ,0x620,
                          "int check_OPP_for_Boolean_matching(struct saucy *, struct coloring *)");
          }
          iVar5 = iVar5 + 1;
        }
        lVar3 = lVar3 + 1;
      }
      if (local_38._4_4_ != iVar4) {
        return 0;
      }
      if ((int)local_38 != iVar5) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

static int
check_OPP_for_Boolean_matching(struct saucy *s, struct coloring *c)
{
    int j, cell;
    int countN1Left, countN2Left;
    int countN1Right, countN2Right;
    char *name; 

    if (c == &s->left)
        return 1;       

    for (cell = 0; cell < s->n; cell += (s->right.clen[cell]+1)) {  
        countN1Left = countN2Left = countN1Right = countN2Right = 0;

        for (j = cell; j <= (cell+s->right.clen[cell]); j++) {

            name = getVertexName(s->pNtk, s->left.lab[j]);
            assert(name[0] == 'N' && name[2] == ':');
            if (name[1] == '1')
                countN1Left++;
            else {
                assert(name[1] == '2');
                countN2Left++;
            }

            name = getVertexName(s->pNtk, s->right.lab[j]);
            assert(name[0] == 'N' && name[2] == ':');
            if (name[1] == '1') 
                countN1Right++;
            else {
                assert(name[1] == '2');
                countN2Right++;
            }

        }

        if (countN1Left != countN2Right || countN2Left != countN1Right)
            return 0;
    }   
    
    return 1;
}